

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transport.cpp
# Opt level: O0

void __thiscall adios2::Transport::WriteV(Transport *this,iovec *iov,int iovcnt,size_t start)

{
  long in_RCX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int c;
  int local_24;
  
  if (in_EDX < 1) {
    if (in_RCX != -1) {
      (**(code **)(*in_RDI + 0x78))(in_RDI,in_RCX);
    }
  }
  else {
    (**(code **)(*in_RDI + 0x30))(in_RDI,*in_RSI,in_RSI[1],in_RCX);
    for (local_24 = 1; local_24 < in_EDX; local_24 = local_24 + 1) {
      (**(code **)(*in_RDI + 0x30))
                (in_RDI,in_RSI[(long)local_24 * 2],in_RSI[(long)local_24 * 2 + 1],0xffffffffffffffff
                );
    }
  }
  return;
}

Assistant:

void Transport::WriteV(const core::iovec *iov, const int iovcnt, size_t start)
{
    if (iovcnt > 0)
    {
        Write(static_cast<const char *>(iov[0].iov_base), iov[0].iov_len, start);
        for (int c = 1; c < iovcnt; ++c)
        {
            Write(static_cast<const char *>(iov[c].iov_base), iov[c].iov_len);
        }
    }
    else if (start != MaxSizeT)
    {
        Seek(start);
    }
}